

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void free_macro_call(macro_call_t mc)

{
  token_arr_t in_RAX;
  size_t sVar1;
  VARR_token_arr_t *pVVar2;
  VARR_token_t *arg;
  token_arr_t local_18;
  
  local_18 = in_RAX;
  VARR_token_tdestroy(&mc->repl_buffer);
  pVVar2 = mc->args;
  if (pVVar2 != (VARR_token_arr_t *)0x0) {
    while (sVar1 = VARR_token_arr_tlength(pVVar2), sVar1 != 0) {
      local_18 = VARR_token_arr_tpop(mc->args);
      VARR_token_tdestroy(&local_18);
      pVVar2 = mc->args;
    }
    pVVar2 = mc->args;
    if ((pVVar2 == (VARR_token_arr_t *)0x0) || (pVVar2->varr == (token_arr_t *)0x0)) {
      mir_varr_assert_fail("destroy","token_arr_t");
    }
    free(pVVar2->varr);
    free(pVVar2);
  }
  free(mc);
  return;
}

Assistant:

static void free_macro_call (macro_call_t mc) {
  VARR_DESTROY (token_t, mc->repl_buffer);
  if (mc->args != NULL) {
    while (VARR_LENGTH (token_arr_t, mc->args) != 0) {
      VARR (token_t) *arg = VARR_POP (token_arr_t, mc->args);
      VARR_DESTROY (token_t, arg);
    }
    VARR_DESTROY (token_arr_t, mc->args);
  }
  free (mc);
}